

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O0

void variance4_sse2(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,int h,__m128i *sse,
                   __m128i *sum)

{
  int iVar1;
  long in_RCX;
  int in_R8D;
  int iVar2;
  undefined4 in_register_00000084;
  __m128i *in_R9;
  __m128i *sum_00;
  undefined8 extraout_XMM0_Qb;
  __m128i alVar3;
  __m128i src_00;
  __m128i r;
  __m128i s;
  int i;
  undefined8 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar4;
  
  iVar1 = (int)in_RCX;
  *(undefined8 *)r[1] = 0;
  *(undefined8 *)(r[1] + 8) = 0;
  iVar2 = in_R8D;
  sum_00 = in_R9;
  for (iVar4 = 0; iVar4 < in_R8D; iVar4 = iVar4 + 2) {
    load4x2_sse2((uint8_t *)CONCAT44(iVar4,in_stack_ffffffffffffffb8),
                 (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
    alVar3 = load4x2_sse2((uint8_t *)CONCAT44(iVar4,in_stack_ffffffffffffffb8),
                          (int)((ulong)extraout_XMM0_Qb >> 0x20));
    alVar3[0] = alVar3[1];
    alVar3[1] = in_RCX;
    src_00[1] = r[1];
    src_00[0] = (longlong)in_R9;
    variance_kernel_sse2(src_00,alVar3,(__m128i *)CONCAT44(in_register_00000084,iVar2),sum_00);
    in_RCX = (long)(iVar1 << 1);
    in_stack_ffffffffffffffb0 = extraout_XMM0_Qb;
  }
  return;
}

Assistant:

static inline void variance4_sse2(const uint8_t *src, const int src_stride,
                                  const uint8_t *ref, const int ref_stride,
                                  const int h, __m128i *const sse,
                                  __m128i *const sum) {
  assert(h <= 256);  // May overflow for larger height.
  *sum = _mm_setzero_si128();

  for (int i = 0; i < h; i += 2) {
    const __m128i s = load4x2_sse2(src, src_stride);
    const __m128i r = load4x2_sse2(ref, ref_stride);

    variance_kernel_sse2(s, r, sse, sum);
    src += 2 * src_stride;
    ref += 2 * ref_stride;
  }
}